

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O2

bool __thiscall
iutest::floating_point<long_double>::AlmostNear
          (floating_point<long_double> *this,_Myt *rhs,longdouble max_abs_error)

{
  longdouble lVar1;
  longdouble lVar2;
  bool bVar3;
  longdouble lVar4;
  _Myt abs;
  _Myt abs_error;
  FInt local_28;
  FInt local_18;
  
  lVar1 = *(longdouble *)&this->m_v;
  if (((~(uint)*(undefined8 *)((long)&this->m_v + 8) & 0x7fff) == 0 &&
       ((undefined1  [16])this->m_v & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0
      ) || (lVar2 = *(longdouble *)&rhs->m_v,
           (~(uint)*(undefined8 *)((long)&rhs->m_v + 8) & 0x7fff) == 0 &&
           ((undefined1  [16])rhs->m_v & (undefined1  [16])0x7fffffffffffffff) !=
           (undefined1  [16])0x0)) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if ((lVar1 != lVar2) || (NAN(lVar1) || NAN(lVar2))) {
      lVar4 = lVar2 - lVar1;
      if (lVar2 <= lVar1 || lVar1 != lVar2) {
        lVar4 = lVar1 - lVar2;
      }
      local_28.iv._10_6_ = 0;
      local_28.iv._0_8_ = SUB108(lVar4,0);
      local_28.iv._8_2_ = (undefined2)((unkuint10)lVar4 >> 0x40);
      bVar3 = true;
      if (max_abs_error < lVar4) {
        local_18.iv._10_6_ = 0;
        local_18.iv._0_8_ = SUB108(max_abs_error,0);
        local_18.iv._8_2_ = (undefined2)((unkuint10)max_abs_error >> 0x40);
        bVar3 = AlmostEquals((floating_point<long_double> *)&local_28,(_Myt *)&local_18);
      }
    }
  }
  return bVar3;
}

Assistant:

bool    AlmostNear(const _Myt& rhs, RawType max_abs_error) const
    {
        if( is_nan() || rhs.is_nan() )
        {
            return false;
        }
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_FLOAT_EQUAL()
        if( m_v.fv == rhs.m_v.fv )
        {
            return true;
        }
IUTEST_PRAGMA_WARN_POP()
        _Myt abs = Abs(rhs);
        if( abs.m_v.fv <= max_abs_error )
        {
            return true;
        }
        _Myt abs_error = _Myt(max_abs_error);
        if( abs.AlmostEquals(abs_error) ) {
            return true;
        }
        return false;
    }